

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_reduce_local_
               (void *inbuf,void *inoutbuf,MPIABI_Fint *count,MPIABI_Fint *datatype,MPIABI_Fint *op,
               MPIABI_Fint *ierror)

{
  mpi_reduce_local_();
  return;
}

Assistant:

void mpiabi_reduce_local_(
  const void * inbuf,
  void * inoutbuf,
  const MPIABI_Fint * count,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * op,
  MPIABI_Fint * ierror
) {
  return mpi_reduce_local_(
    inbuf,
    inoutbuf,
    count,
    datatype,
    op,
    ierror
  );
}